

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_write_header(mcpl_outfileinternal_t *f)

{
  int iVar1;
  long in_RDI;
  uint32_t i;
  uint32_t arr [8];
  int64_t nparticles_pos;
  size_t nb;
  uchar start [8];
  char *errmsg;
  char *in_stack_ffffffffffffff98;
  char *errmsg_00;
  char *str;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  uint local_2c;
  long local_28;
  size_t local_20;
  undefined8 local_18;
  char *local_10;
  long local_8;
  
  local_8 = in_RDI;
  if (*(int *)(in_RDI + 0x60) == 0) {
    mcpl_error((char *)0x102250);
  }
  local_10 = "Errors encountered while attempting to write file header.";
  local_18 = 0x4c3330304c50434d;
  iVar1 = mcpl_platform_is_little_endian();
  if (iVar1 == 0) {
    local_18 = CONCAT17(0x42,(undefined7)local_18);
  }
  local_20 = fwrite(&local_18,1,8,*(FILE **)(local_8 + 8));
  if (local_20 != 8) {
    mcpl_error((char *)0x1022ba);
  }
  local_28 = ftell(*(FILE **)(local_8 + 8));
  if (local_28 != 8) {
    mcpl_error((char *)0x1022df);
  }
  local_20 = fwrite((void *)(local_8 + 0x68),1,8,*(FILE **)(local_8 + 8));
  if (local_20 != 8) {
    mcpl_error((char *)0x102317);
  }
  local_48 = *(undefined4 *)(local_8 + 0x18);
  local_44 = *(undefined4 *)(local_8 + 0x28);
  local_40 = *(undefined4 *)(local_8 + 0x48);
  local_3c = *(undefined4 *)(local_8 + 0x4c);
  local_38 = *(undefined4 *)(local_8 + 0x50);
  local_34 = *(undefined4 *)(local_8 + 0x54);
  local_30 = *(undefined4 *)(local_8 + 0x70);
  local_2c = (uint)(*(double *)(local_8 + 0x58) != 0.0);
  local_20 = fwrite(&local_48,1,0x20,*(FILE **)(local_8 + 8));
  if (local_20 != 0x20) {
    mcpl_error((char *)0x1023c8);
  }
  if (((*(double *)(local_8 + 0x58) != 0.0) || (NAN(*(double *)(local_8 + 0x58)))) &&
     (local_20 = fwrite((void *)(local_8 + 0x58),1,8,*(FILE **)(local_8 + 8)), local_20 != 8)) {
    mcpl_error((char *)0x102417);
  }
  str = *(char **)(local_8 + 8);
  if (*(long *)(local_8 + 0x10) == 0) {
    errmsg_00 = "unknown";
  }
  else {
    errmsg_00 = *(char **)(local_8 + 0x10);
  }
  mcpl_write_string((FILE *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),str,
                    errmsg_00);
  for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x18); uVar2 = uVar2 + 1) {
    mcpl_write_string((FILE *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),str,errmsg_00);
  }
  for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x28); uVar2 = uVar2 + 1) {
    mcpl_write_string((FILE *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),str,errmsg_00);
  }
  for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x28); uVar2 = uVar2 + 1) {
    mcpl_write_buffer((FILE *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),
                      (uint32_t)((ulong)str >> 0x20),errmsg_00,in_stack_ffffffffffffff98);
  }
  free(*(void **)(local_8 + 0x10));
  *(undefined8 *)(local_8 + 0x10) = 0;
  if (*(int *)(local_8 + 0x18) != 0) {
    for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x18); uVar2 = uVar2 + 1) {
      free(*(void **)(*(long *)(local_8 + 0x20) + (ulong)uVar2 * 8));
    }
    free(*(void **)(local_8 + 0x20));
    *(undefined8 *)(local_8 + 0x20) = 0;
    *(undefined4 *)(local_8 + 0x18) = 0;
  }
  if (*(int *)(local_8 + 0x28) != 0) {
    for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x28); uVar2 = uVar2 + 1) {
      free(*(void **)(*(long *)(local_8 + 0x30) + (ulong)uVar2 * 8));
    }
    free(*(void **)(local_8 + 0x30));
    *(undefined8 *)(local_8 + 0x30) = 0;
    for (uVar2 = 0; uVar2 < *(uint *)(local_8 + 0x28); uVar2 = uVar2 + 1) {
      free(*(void **)(*(long *)(local_8 + 0x40) + (ulong)uVar2 * 8));
    }
    free(*(void **)(local_8 + 0x40));
    *(undefined8 *)(local_8 + 0x40) = 0;
    free(*(void **)(local_8 + 0x38));
    *(undefined8 *)(local_8 + 0x38) = 0;
    *(undefined4 *)(local_8 + 0x28) = 0;
  }
  *(undefined4 *)(local_8 + 0x60) = 0;
  return;
}

Assistant:

MCPL_LOCAL void mcpl_write_header(mcpl_outfileinternal_t * f)
{
  if (!f->header_notwritten)
    mcpl_error("Logical error!");

  const char * errmsg="Errors encountered while attempting to write file header.";
  //Always start the file with an unsigned char-array (for endian agnosticity)
  //containing magic word (MCPL), file format version ('001'-'999') and
  //endianness used in the file ('L' or 'B'):
  unsigned char start[8] = {'M','C','P','L','0','0','0','L'};
  start[4] = (MCPL_FORMATVERSION/100)%10 + '0';
  start[5] = (MCPL_FORMATVERSION/10)%10 + '0';
  start[6] = MCPL_FORMATVERSION%10 + '0';
  if (!mcpl_platform_is_little_endian())
    start[7] = 'B';
  size_t nb = fwrite(start, 1, sizeof(start), f->file);
  if (nb!=sizeof(start))
    mcpl_error(errmsg);

  //Right after the initial 8 bytes, we put the number of particles (0 for now,
  //but important that position is fixed so we can seek and update it later).:
  int64_t nparticles_pos = MCPL_FTELL(f->file);
  if (nparticles_pos!=MCPLIMP_NPARTICLES_POS)
    mcpl_error(errmsg);
  nb = fwrite(&f->nparticles, 1, sizeof(f->nparticles), f->file);
  if (nb!=sizeof(f->nparticles))
    mcpl_error(errmsg);

  //Then a bunch of numbers:
  uint32_t arr[8];
  arr[0] = f->ncomments;
  arr[1] = f->nblobs;
  arr[2] = f->opt_userflags;
  arr[3] = f->opt_polarisation;
  arr[4] = f->opt_singleprec;
  arr[5] = (uint32_t)f->opt_universalpdgcode;
  arr[6] = f->particle_size;
  arr[7] = (f->opt_universalweight?1:0);
  MCPL_STATIC_ASSERT(sizeof(arr)==32);
  nb = fwrite(arr, 1, sizeof(arr), f->file);
  if (nb!=sizeof(arr))
    mcpl_error(errmsg);

  if (f->opt_universalweight) {
    MCPL_STATIC_ASSERT(sizeof(f->opt_universalweight)==8);
    nb = fwrite((void*)(&(f->opt_universalweight)), 1, sizeof(f->opt_universalweight), f->file);
    if (nb!=sizeof(f->opt_universalweight))
      mcpl_error(errmsg);
  }

  //strings:
  mcpl_write_string(f->file,f->hdr_srcprogname?f->hdr_srcprogname:"unknown",errmsg);
  uint32_t i;
  for (i = 0; i < f->ncomments; ++i)
    mcpl_write_string(f->file,f->comments[i],errmsg);

  //blob keys:
  for (i = 0; i < f->nblobs; ++i)
    mcpl_write_string(f->file,f->blobkeys[i],errmsg);

  //blobs:
  for (i = 0; i < f->nblobs; ++i)
    mcpl_write_buffer(f->file, f->bloblengths[i], f->blobs[i],errmsg);

  //Free up acquired memory only needed for header writing:
  free(f->hdr_srcprogname);
  f->hdr_srcprogname = NULL;
  if (f->ncomments) {
    for (i = 0; i < f->ncomments; ++i)
      free(f->comments[i]);
    free(f->comments);
    f->comments = NULL;
    f->ncomments = 0;
  }
  if (f->nblobs) {
    for (i = 0; i < f->nblobs; ++i)
      free(f->blobkeys[i]);
    free(f->blobkeys);
    f->blobkeys = NULL;
    for (i = 0; i < f->nblobs; ++i)
      free(f->blobs[i]);
    free(f->blobs);
    f->blobs = NULL;
    free(f->bloblengths);
    f->bloblengths = NULL;
    f->nblobs = 0;
  }
  f->header_notwritten = 0;
}